

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O0

void __thiscall ADPlanner::BuildNewOPENList(ADPlanner *this,ADSearchStateSpace_t *pSearchStateSpace)

{
  long in_RSI;
  long *in_RDI;
  CList *pinconslist;
  CHeap *pheap;
  CKey key;
  ADState *state;
  CKey local_78;
  CKey local_68 [2];
  undefined1 local_48 [8];
  CKey *in_stack_ffffffffffffffc0;
  CList *this_00;
  CHeap *this_01;
  CKey local_28;
  AbstractSearchState *local_18;
  long local_10;
  
  local_10 = in_RSI;
  CKey::CKey(&local_28);
  this_01 = *(CHeap **)(local_10 + 0x10);
  this_00 = *(CList **)(local_10 + 0x18);
  while (this_00->firstelement != (listelement *)0x0) {
    local_18 = this_00->firstelement->liststate;
    (**(code **)(*in_RDI + 0x1b0))(local_48,in_RDI,local_18);
    CKey::operator=(&local_28,(CKey *)local_48);
    CKey::~CKey((CKey *)local_48);
    if (local_18->heapindex == 0) {
      local_68[0].key[0] = local_28.key[0];
      local_68[0].key[1] = local_28.key[1];
      CHeap::insertheap((CHeap *)key.key[0],(AbstractSearchState *)pheap,(CKey *)pinconslist);
      CKey::~CKey(local_68);
    }
    else {
      local_78.key[0] = local_28.key[0];
      local_78.key[1] = local_28.key[1];
      CHeap::updateheap(this_01,(AbstractSearchState *)this_00,in_stack_ffffffffffffffc0);
      CKey::~CKey(&local_78);
    }
    CList::remove(this_00,(char *)local_18);
  }
  *(undefined1 *)(local_10 + 0x52) = 0;
  CKey::~CKey(&local_28);
  return;
}

Assistant:

void ADPlanner::BuildNewOPENList(ADSearchStateSpace_t* pSearchStateSpace)
{
    ADState *state;
    CKey key;
    CHeap* pheap = pSearchStateSpace->heap;
    CList* pinconslist = pSearchStateSpace->inconslist;

    //move incons into open
    while (pinconslist->firstelement != NULL) {
        state = (ADState*)pinconslist->firstelement->liststate;

        //compute f-value
        key = ComputeKey(state);

        //insert into OPEN
        if (state->heapindex == 0)
            pheap->insertheap(state, key);
        else
            pheap->updateheap(state, key); //should never happen, but sometimes it does - somewhere there is a bug TODO
        //remove from INCONS
        pinconslist->remove(state, AD_INCONS_LIST_ID);
    }

    pSearchStateSpace->bRebuildOpenList = false;
}